

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(data_view *data,DataType baseType,Time *val)

{
  string_view timeString;
  string_view val_00;
  string_view val_01;
  bool bVar1;
  uint uVar2;
  long timecodeval;
  longlong lVar3;
  size_type sVar4;
  TimeRepresentation<count_time<9,_long>_> TVar5;
  reference this;
  size_type sVar6;
  int64_t timecodeval_00;
  TimeRepresentation<count_time<9,_long>_> *in_RDX;
  undefined4 in_ESI;
  int64_t intVal;
  NamedPoint point;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  complex<double> cval;
  vector<double,_std::allocator<double>_> vec;
  longlong timeCode;
  basic_string_view<char,_std::char_traits<char>_> stringData;
  size_t index;
  size_t *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  allocator<char> *in_stack_fffffffffffffe70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Time *in_stack_fffffffffffffef8;
  defV *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  double local_e0;
  baseType local_d8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_d0;
  complex<double> local_b8;
  baseType local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_69;
  longlong local_48;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  size_type local_20;
  TimeRepresentation<count_time<9,_long>_> *local_18;
  
  local_18 = in_RDX;
  switch(in_ESI) {
  case 0:
  case 9:
  default:
    local_30 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                         ((data_view *)in_stack_fffffffffffffe40);
    this_00 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (this_00,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    lVar3 = std::__cxx11::stoll(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,0);
    std::__cxx11::string::~string(in_stack_fffffffffffffe40);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_48 = lVar3;
    if (local_20 != 0xffffffffffffffff) {
      sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_30);
      if (local_20 != sVar4) {
        timeString._M_str = in_stack_fffffffffffffe48;
        timeString._M_len = (size_t)in_stack_fffffffffffffe40;
        local_88 = local_30;
        TVar5 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                          (timeString);
        local_18->internalTimeCode = TVar5.internalTimeCode;
        return;
      }
    }
    TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode(local_18,local_48);
    break;
  case 1:
    ValueConverter<double>::interpret((data_view *)in_stack_fffffffffffffe40);
    TimeRepresentation<count_time<9,_long>_>::operator=
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe40,
               (double)in_stack_fffffffffffffe38);
    break;
  case 2:
  case 8:
    timecodeval = ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe40);
    TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode(in_RDX,timecodeval);
    break;
  case 3:
    ValueConverter<std::complex<double>_>::interpret((data_view *)in_stack_fffffffffffffe40);
    std::complex<double>::real_abi_cxx11_(&local_b8);
    TimeRepresentation<count_time<9,_long>_>::operator=
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe40,
               (double)in_stack_fffffffffffffe38);
    break;
  case 4:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((data_view *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_fffffffffffffe50);
    if (bVar1) {
      local_a8 = 0;
    }
    else {
      std::vector<double,_std::allocator<double>_>::operator[](&local_a0,0);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe40,
                 (double)in_stack_fffffffffffffe38);
    }
    local_18->internalTimeCode = local_a8;
    CLI::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50);
    break;
  case 5:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((data_view *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    bVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::empty
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       in_stack_fffffffffffffe50);
    if (bVar1) {
      local_d8 = 0;
    }
    else {
      this = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                       (&local_d0,0);
      std::complex<double>::real_abi_cxx11_(this);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe40,
                 (double)in_stack_fffffffffffffe38);
    }
    local_18->internalTimeCode = local_d8;
    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe50);
    break;
  case 6:
    ValueConverter<helics::NamedPoint>::interpret
              ((data_view *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    uVar2 = std::isnan(local_e0);
    if ((uVar2 & 1) == 0) {
      TimeRepresentation<count_time<9,_long>_>::operator=
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe40,
                 (double)in_stack_fffffffffffffe38);
    }
    else {
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (in_stack_fffffffffffffe60,
                         (char *)CONCAT17((char)uVar2,in_stack_fffffffffffffe58),
                         (size_type)in_stack_fffffffffffffe50);
      if (sVar6 == 0xffffffffffffffff) {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe40);
        val_00._M_str = in_stack_fffffffffffffe68;
        val_00._M_len = (size_t)in_stack_fffffffffffffe60;
        timecodeval_00 = getIntFromString(val_00);
        TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode(local_18,timecodeval_00);
      }
      else {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe40);
        val_01._M_str = in_stack_ffffffffffffff08;
        val_01._M_len = (size_t)in_stack_ffffffffffffff00;
        getDoubleFromString(val_01);
        TimeRepresentation<count_time<9,_long>_>::operator=
                  ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe40,
                   (double)in_stack_fffffffffffffe38);
      }
    }
    NamedPoint::~NamedPoint((NamedPoint *)0x2b8f5b);
    break;
  case 0x1e:
    readJsonValue_abi_cxx11_
              ((data_view *)
               vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    valueExtract(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    CLI::std::
    variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x2b8f92);
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, Time& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val = ValueConverter<double>::interpret(data);
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            val.setBaseTimeCode(ValueConverter<int64_t>::interpret(data));
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            size_t index;
            try {
                auto stringData = ValueConverter<std::string_view>::interpret(data);
                auto timeCode = std::stoll(std::string(stringData), &index);
                if ((index == std::string::npos) || (index == stringData.size())) {
                    val.setBaseTimeCode(timeCode);
                } else {
                    val = gmlc::utilities::loadTimeFromString<helics::Time>(stringData);
                }
            }
            catch (...) {
                val = timeZero;
            }

            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            val = (!vec.empty()) ? Time(vec[0]) : timeZero;
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val = cval.real();
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = (!cvec.empty()) ? Time(cvec[0].real()) : timeZero;
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto point = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(point.value)) {
                if (point.name.find(".[eE") == std::string::npos) {
                    const std::int64_t intVal = getIntFromString(point.name);
                    val.setBaseTimeCode(intVal);
                } else {
                    val = getDoubleFromString(point.name);
                }
            } else {
                val = point.value;
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}